

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
* xmotion::utils::
  ReconstructPath<xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::vertex_iterator>
            (vertex_iterator start_vtx,vertex_iterator goal_vtx)

{
  bool bVar1;
  Vertex *pVVar2;
  __node_type *in_RDX;
  __normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
  in_RDI;
  vertex_iterator waypoint;
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  *path;
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
  __first;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  local_28;
  undefined1 local_19;
  __node_type *local_18;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  local_10 [2];
  
  local_19 = 0;
  __first._M_current = in_RDI._M_current;
  local_18 = in_RDX;
  std::
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  ::vector((vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
            *)0x101a1a);
  local_28._M_cur = local_18;
  while (bVar1 = std::__detail::operator!=(&local_28,local_10), bVar1) {
    std::
    vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
    ::push_back((vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
                 *)__first._M_current,in_RDI._M_current);
    pVVar2 = Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator::
             operator->((vertex_iterator *)0x101a54);
    local_28._M_cur =
         (pVVar2->search_parent).super_const_vertex_iterator.super_VertexMapTypeIterator.
         super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
         ._M_cur;
  }
  std::
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  ::push_back((vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
               *)__first._M_current,in_RDI._M_current);
  std::
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  ::begin(in_stack_ffffffffffffff98);
  std::
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  ::end(in_stack_ffffffffffffff98);
  std::
  reverse<__gnu_cxx::__normal_iterator<xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::vertex_iterator*,std::vector<xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::vertex_iterator,std::allocator<xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::vertex_iterator>>>>
            (__first,in_RDI);
  return (vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
          *)__first._M_current;
}

Assistant:

static std::vector<VertexIterator> ReconstructPath(VertexIterator start_vtx,
                                                   VertexIterator goal_vtx) {
  std::vector<VertexIterator> path;
  VertexIterator waypoint = goal_vtx;
  while (waypoint != start_vtx) {
    path.push_back(waypoint);
    waypoint = waypoint->search_parent;
  }
  // add the start node
  path.push_back(waypoint);
  std::reverse(path.begin(), path.end());
#ifndef MINIMAL_PRINTOUT
  auto traj_s = path.begin();
  auto traj_e = path.end() - 1;
  std::cout << "starting vertex id: " << (*traj_s)->vertex_id_ << std::endl;
  std::cout << "finishing vertex id: " << (*traj_e)->vertex_id_ << std::endl;
  std::cout << "path length: " << path.size() << std::endl;
  std::cout << "total cost: " << path.back()->g_cost << std::endl;
#endif
  return path;
}